

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O1

void __thiscall
capnp::_::anon_unknown_0::MembranePolicyImpl::~MembranePolicyImpl(MembranePolicyImpl *this)

{
  ForkHub<kj::_::Void> *pFVar1;
  Disposer *pDVar2;
  
  (this->super_MembranePolicy)._vptr_MembranePolicy = (_func_int **)&PTR_inboundCall_006e23f0;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_006e2468;
  if (((this->revokePromise).ptr.isSet == true) &&
     (pFVar1 = (this->revokePromise).ptr.field_1.value.hub.ptr,
     pFVar1 != (ForkHub<kj::_::Void> *)0x0)) {
    (this->revokePromise).ptr.field_1.value.hub.ptr = (ForkHub<kj::_::Void> *)0x0;
    pDVar2 = (this->revokePromise).ptr.field_1.value.hub.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pFVar1->super_ForkHubBase).super_PromiseArenaMember.
                              _vptr_PromiseArenaMember +
                      (long)(pFVar1->super_ForkHubBase).super_PromiseArenaMember.
                            _vptr_PromiseArenaMember[-2]));
  }
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  MembranePolicy::~MembranePolicy(&this->super_MembranePolicy);
  operator_delete(this,0xc0);
  return;
}

Assistant:

MembranePolicyImpl() = default;